

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int testall_dict(void)

{
  int iVar1;
  xmlDict *dict_00;
  uint local_14;
  int ret;
  xmlDictPtr dict;
  
  strings1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings1,0,800000);
  strings2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings2,0,800000);
  test1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test1,0,800000);
  test2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test2,0,800000);
  fill_string_pool(strings1,seeds1);
  fill_string_pool(strings2,seeds2);
  dict_00 = (xmlDict *)xmlDictCreate();
  if (dict_00 == (xmlDict *)0x0) {
    fprintf(_stderr,"Out of memory while creating dictionary\n");
    exit(1);
  }
  iVar1 = test_dict(dict_00);
  local_14 = (uint)(iVar1 != 0);
  iVar1 = test_subdict(dict_00);
  if (iVar1 != 0) {
    local_14 = 1;
  }
  xmlDictFree(dict_00);
  clean_strings();
  (*_xmlFree)(strings1);
  (*_xmlFree)(strings2);
  (*_xmlFree)(test1);
  (*_xmlFree)(test2);
  return local_14;
}

Assistant:

static int
testall_dict(void) {
    xmlDictPtr dict;
    int ret = 0;

    strings1 = xmlMalloc(NB_STRINGS_MAX * sizeof(strings1[0]));
    memset(strings1, 0, NB_STRINGS_MAX * sizeof(strings1[0]));
    strings2 = xmlMalloc(NB_STRINGS_MAX * sizeof(strings2[0]));
    memset(strings2, 0, NB_STRINGS_MAX * sizeof(strings2[0]));
    test1 = xmlMalloc(NB_STRINGS_MAX * sizeof(test1[0]));
    memset(test1, 0, NB_STRINGS_MAX * sizeof(test1[0]));
    test2 = xmlMalloc(NB_STRINGS_MAX * sizeof(test2[0]));
    memset(test2, 0, NB_STRINGS_MAX * sizeof(test2[0]));

    fill_string_pool(strings1, seeds1);
    fill_string_pool(strings2, seeds2);
#ifdef WITH_PRINT
    print_strings();
#endif

    dict = xmlDictCreate();
    if (dict == NULL) {
	fprintf(stderr, "Out of memory while creating dictionary\n");
	exit(1);
    }
    if (test_dict(dict) != 0) {
        ret = 1;
    }
    if (test_subdict(dict) != 0) {
        ret = 1;
    }
    xmlDictFree(dict);

    clean_strings();
    xmlFree(strings1);
    xmlFree(strings2);
    xmlFree(test1);
    xmlFree(test2);

    return ret;
}